

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.h
# Opt level: O0

void __thiscall
slang::ast::HierarchyOverrideNode::~HierarchyOverrideNode(HierarchyOverrideNode *this)

{
  vector<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
  *unaff_retaddr;
  
  std::
  vector<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
  ::~vector(unaff_retaddr);
  boost::unordered::
  unordered_flat_map<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  ::~unordered_flat_map
            ((unordered_flat_map<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
              *)0x549bca);
  boost::unordered::
  unordered_flat_map<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
  ::~unordered_flat_map
            ((unordered_flat_map<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
              *)0x549bd4);
  return;
}

Assistant:

struct SLANG_EXPORT HierarchyOverrideNode {
    /// A map of parameters in the current scope to override.
    /// The key is the syntax node representing the parameter and the value is a pair,
    /// the first element of which is the value to set the parameter to and the second
    /// is the source defparam doing the overriding, if any (can be null).
    flat_hash_map<const syntax::SyntaxNode*, std::pair<ConstantValue, const syntax::SyntaxNode*>>
        paramOverrides;

    /// A map of child scopes that also contain overrides.
    flat_hash_map<OpaqueInstancePath::Entry, HierarchyOverrideNode> childNodes;

    /// A list of bind directives to apply in this scope.
    /// The first entry is info about the bind instantiation, and the
    /// second is an optional pointer to the definition it targets.
    /// If the target is null, then the bind is actually targeting the
    /// scope represented by this override node.
    std::vector<std::pair<BindDirectiveInfo, const syntax::SyntaxNode*>> binds;
}